

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

Module * codegen(Module *__return_storage_ptr__,Module *irModule)

{
  Module local_60;
  
  mocker::runInstructionSelection(__return_storage_ptr__,irModule);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\nNASM:\n",7);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"After instruction selection:\n",0x1d);
  local_60.directives.
  super__Vector_base<std::shared_ptr<mocker::nasm::Directive>,_std::allocator<std::shared_ptr<mocker::nasm::Directive>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)__return_storage_ptr__;
  printNasmStats((Stats *)&local_60);
  mocker::allocateRegisters(&local_60,__return_storage_ptr__);
  mocker::nasm::Module::operator=(__return_storage_ptr__,&local_60);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_60.sections._M_h);
  std::
  vector<std::shared_ptr<mocker::nasm::Directive>,_std::allocator<std::shared_ptr<mocker::nasm::Directive>_>_>
  ::~vector(&local_60.directives);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\nAfter register allocation:\n",0x1c);
  local_60.directives.
  super__Vector_base<std::shared_ptr<mocker::nasm::Directive>,_std::allocator<std::shared_ptr<mocker::nasm::Directive>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)__return_storage_ptr__;
  printNasmStats((Stats *)&local_60);
  mocker::runPeepholeOptimization(&local_60,__return_storage_ptr__);
  mocker::nasm::Module::operator=(__return_storage_ptr__,&local_60);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::nasm::Section>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_60.sections._M_h);
  std::
  vector<std::shared_ptr<mocker::nasm::Directive>,_std::allocator<std::shared_ptr<mocker::nasm::Directive>_>_>
  ::~vector(&local_60.directives);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"\nAfter peephole optimization:\n",0x1e);
  local_60.directives.
  super__Vector_base<std::shared_ptr<mocker::nasm::Directive>,_std::allocator<std::shared_ptr<mocker::nasm::Directive>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)__return_storage_ptr__;
  printNasmStats((Stats *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

mocker::nasm::Module codegen(const mocker::ir::Module &irModule) {
  using namespace mocker;
  auto res = runInstructionSelection(irModule);
  //  nasm::printModule(res);

  std::cerr << "\nNASM:\n";
  std::cerr << "After instruction selection:\n";
  printNasmStats(nasm::Stats(res));

  res = allocateRegisters(res);
  //  res = allocateRegistersNaively(res);
  std::cerr << "\nAfter register allocation:\n";
  printNasmStats(nasm::Stats(res));

  //  nasm::printModule(res, std::cerr);

  res = runPeepholeOptimization(res);
  std::cerr << "\nAfter peephole optimization:\n";
  printNasmStats(nasm::Stats(res));
  return res;
}